

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

string_view __thiscall slang::parsing::Token::rawText(Token *this)

{
  uint uVar1;
  Info *pIVar2;
  logic_error *this_00;
  string_view sVar3;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar3 = LexerFacts::getTokenKindText(this->kind);
  if (sVar3._M_len != 0) {
    return sVar3;
  }
  switch(this->kind) {
  case Unknown:
    pIVar2 = this->info;
    if (pIVar2 == (Info *)0x0) goto switchD_001879f1_caseD_1;
    break;
  case EndOfFile:
  case Placeholder:
switchD_001879f1_caseD_1:
    return (string_view)(ZEXT816(0x344831) << 0x40);
  default:
    uVar1 = this->kind - 0x158;
    if ((7 < uVar1) || ((199U >> (uVar1 & 0x1f) & 1) == 0)) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Token.cpp"
                 ,&local_d9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0x125);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  case Identifier:
  case SystemIdentifier:
  case StringLiteral:
  case IntegerLiteral:
  case IntegerBase:
  case UnbasedUnsizedLiteral:
  case RealLiteral:
  case TimeLiteral:
    pIVar2 = this->info;
  }
  sVar3._M_str = pIVar2->rawTextPtr;
  sVar3._M_len = (ulong)this->rawLen;
  return sVar3;
}

Assistant:

string_view Token::rawText() const {
    string_view text = LexerFacts::getTokenKindText(kind);
    if (!text.empty())
        return text;

    // not a simple token, so extract info from our data pointer
    switch (kind) {
        case TokenKind::Identifier:
        case TokenKind::SystemIdentifier:
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
        case TokenKind::IntegerLiteral:
        case TokenKind::IntegerBase:
        case TokenKind::UnbasedUnsizedLiteral:
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
        case TokenKind::EmptyMacroArgument:
        case TokenKind::LineContinuation:
            return string_view(info->rawTextPtr, rawLen);
        case TokenKind::Unknown:
            if (info)
                return string_view(info->rawTextPtr, rawLen);
            return "";
        case TokenKind::Placeholder:
        case TokenKind::EndOfFile:
            return "";
        default:
            ASSUME_UNREACHABLE;
    }
}